

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O3

bool __thiscall
cmm::CMMParser::parseBinOpRHS
          (CMMParser *this,int8_t ExprPrec,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res)

{
  TokenKind TokenKind;
  ExpressionAST *pEVar1;
  pointer pcVar2;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> _Var3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  bool bVar6;
  int8_t iVar7;
  int8_t iVar8;
  Token TVar9;
  ExpressionAST *pEVar10;
  pointer *__ptr;
  undefined7 in_register_00000031;
  bool bVar11;
  string Symbol;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_98;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_90;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_88;
  undefined1 local_80 [8];
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_78;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_70;
  undefined4 local_64;
  undefined1 local_60 [32];
  AST local_40;
  CMMLexer *local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000031,ExprPrec);
  local_98._M_head_impl = (ExpressionAST *)0x0;
  if ((this->Lexer).CurTok.Kind == Equal) {
    TVar9 = CMMLexer::LexToken(&this->Lexer);
    (this->Lexer).CurTok.Kind = TVar9.Kind;
    bVar6 = parseExpression(this,(unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                                  *)&local_98);
    bVar11 = true;
    if (!bVar6) {
      local_70._M_head_impl =
           (Res->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      (Res->_M_t).
      super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
      local_78._M_head_impl = local_98._M_head_impl;
      local_98._M_head_impl = (ExpressionAST *)0x0;
      BinaryOperatorAST::create
                ((BinaryOperatorAST *)local_60,Equal,
                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &local_70,
                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &local_78);
      uVar5 = local_60._0_8_;
      local_60._0_8_ = (_func_int **)0x0;
      pEVar1 = (Res->_M_t).
               super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
               .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      (Res->_M_t).
      super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)uVar5;
      if ((pEVar1 != (ExpressionAST *)0x0) &&
         ((*(pEVar1->super_AST)._vptr_AST[1])(), (_func_int **)local_60._0_8_ != (_func_int **)0x0))
      {
        (**(code **)(*(_func_int **)local_60._0_8_ + 8))();
      }
      local_60._0_8_ = (ExpressionAST *)0x0;
      if (local_78._M_head_impl != (ExpressionAST *)0x0) {
        (*((local_78._M_head_impl)->super_AST)._vptr_AST[1])();
      }
      local_78._M_head_impl = (ExpressionAST *)0x0;
      if (local_70._M_head_impl != (ExpressionAST *)0x0) {
        (*((local_70._M_head_impl)->super_AST)._vptr_AST[1])();
      }
      local_70._M_head_impl = (ExpressionAST *)0x0;
      bVar11 = false;
    }
  }
  else {
    local_40._vptr_AST = (_func_int **)&PTR__InfixOpExprAST_001239b0;
    local_38 = &this->Lexer;
    do {
      TokenKind = (this->Lexer).CurTok.Kind;
      iVar7 = getBinOpPrecedence(this);
      bVar11 = (char)local_64 <= iVar7;
      if (iVar7 < (char)local_64) break;
      pcVar2 = (this->Lexer).StrVal._M_dataplus._M_p;
      local_60._0_8_ = (ExpressionAST *)(local_60 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar2,pcVar2 + (this->Lexer).StrVal._M_string_length);
      TVar9 = CMMLexer::LexToken(local_38);
      (this->Lexer).CurTok.Kind = TVar9.Kind;
      bVar6 = parsePrimaryExpression
                        (this,(unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                               *)&local_98);
      if ((bVar6) ||
         ((iVar8 = getBinOpPrecedence(this), iVar7 < iVar8 &&
          (bVar6 = parseBinOpRHS(this,iVar7 + '\x01',
                                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                                  *)&local_98), bVar6)))) {
        bVar6 = false;
      }
      else if (TokenKind == InfixOp) {
        pEVar10 = (ExpressionAST *)operator_new(0x40);
        _Var3._M_head_impl = local_98._M_head_impl;
        pEVar1 = (Res->_M_t).
                 super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                 .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
        local_98._M_head_impl = (ExpressionAST *)0x0;
        pEVar10->Kind = InfixOpExpression;
        (pEVar10->super_AST)._vptr_AST = local_40._vptr_AST;
        pEVar10[1].super_AST._vptr_AST = (_func_int **)(pEVar10 + 2);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(pEVar10 + 1),local_60._0_8_,local_60._8_8_ + local_60._0_8_);
        pEVar10[3].super_AST._vptr_AST = (_func_int **)pEVar1;
        *(ExpressionAST **)&pEVar10[3].Kind = _Var3._M_head_impl;
        pEVar1 = (Res->_M_t).
                 super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                 .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = pEVar10;
        bVar6 = true;
        if (pEVar1 != (ExpressionAST *)0x0) {
          (*(pEVar1->super_AST)._vptr_AST[1])();
        }
      }
      else {
        local_88._M_head_impl =
             (Res->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
        local_90._M_head_impl = local_98._M_head_impl;
        local_98._M_head_impl = (ExpressionAST *)0x0;
        BinaryOperatorAST::tryFoldBinOp
                  ((BinaryOperatorAST *)local_80,TokenKind,
                   (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                   &local_88,
                   (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                   &local_90);
        auVar4 = local_80;
        local_80 = (undefined1  [8])0x0;
        pEVar1 = (Res->_M_t).
                 super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                 .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
        (Res->_M_t).
        super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
        super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
        super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)auVar4;
        if ((pEVar1 != (ExpressionAST *)0x0) &&
           ((*(pEVar1->super_AST)._vptr_AST[1])(), local_80 != (undefined1  [8])0x0)) {
          (**(code **)(*(_func_int **)local_80 + 8))();
        }
        local_80 = (undefined1  [8])0x0;
        if (local_90._M_head_impl != (ExpressionAST *)0x0) {
          (*((local_90._M_head_impl)->super_AST)._vptr_AST[1])();
        }
        local_90._M_head_impl = (ExpressionAST *)0x0;
        if (local_88._M_head_impl != (ExpressionAST *)0x0) {
          (*((local_88._M_head_impl)->super_AST)._vptr_AST[1])();
        }
        local_88._M_head_impl = (ExpressionAST *)0x0;
        bVar6 = true;
      }
      if ((ExpressionAST *)local_60._0_8_ != (ExpressionAST *)(local_60 + 0x10)) {
        operator_delete((void *)local_60._0_8_);
      }
    } while (bVar6);
  }
  if (local_98._M_head_impl != (ExpressionAST *)0x0) {
    (*((local_98._M_head_impl)->super_AST)._vptr_AST[1])();
  }
  return bVar11;
}

Assistant:

bool CMMParser::parseBinOpRHS(int8_t ExprPrec,
                              std::unique_ptr<ExpressionAST> &Res) {
  std::unique_ptr<ExpressionAST> RHS;

  // Handle assignment expression first.
  if (Lexer.getTok().is(Token::Equal)) {
    Lex();
    if (parseExpression(RHS))
      return true;
    Res = BinaryOperatorAST::create(Token::Equal,
                                    std::move(Res), std::move(RHS));
    return false;
  }
  for (;;) {
    Token::TokenKind TokenKind = getKind();

    // If this is a binOp, find its precedence.
    int8_t TokPrec = getBinOpPrecedence();
    // If the next token is lower precedence than we are allowed to eat,
    // return successfully with what we ate already.
    if (TokPrec < ExprPrec)
      return false;

    // Save the potential symbol before lex.
    std::string Symbol = Lexer.getStrVal();
    // Eat the binary operator.
    Lex();
    // Eat the next primary expression.
    if (parsePrimaryExpression(RHS))
      return true;

    // If BinOp binds less tightly with RHS than the operator after RHS, let
    // the pending operator take RHS as its LHS.
    int8_t NextPrec = getBinOpPrecedence();
    if (TokPrec < NextPrec && parseBinOpRHS(++TokPrec, RHS))
      return true;

    // Merge LHS and RHS according to operator.
    if (TokenKind == Token::InfixOp)
      Res.reset(new InfixOpExprAST(Symbol, std::move(Res), std::move(RHS)));
    else
      Res = BinaryOperatorAST::tryFoldBinOp(TokenKind, std::move(Res),
                                             std::move(RHS));
  }
}